

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenArrayFill(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                 BinaryenExpressionRef value,BinaryenExpressionRef size)

{
  ArrayFill *pAVar1;
  Builder local_38;
  Expression *local_30;
  BinaryenExpressionRef size_local;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef index_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef module_local;
  
  local_30 = size;
  size_local = value;
  value_local = index;
  index_local = ref;
  ref_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_38,module);
  pAVar1 = wasm::Builder::makeArrayFill(&local_38,index_local,value_local,size_local,local_30);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayFill(BinaryenModuleRef module,
                                        BinaryenExpressionRef ref,
                                        BinaryenExpressionRef index,
                                        BinaryenExpressionRef value,
                                        BinaryenExpressionRef size) {
  return static_cast<Expression*>(Builder(*(Module*)module)
                                    .makeArrayFill((Expression*)ref,
                                                   (Expression*)index,
                                                   (Expression*)value,
                                                   (Expression*)size));
}